

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O2

OperatorResultType __thiscall
duckdb::AsOfLocalState::ExecuteInternal
          (AsOfLocalState *this,ExecutionContext *context,DataChunk *input,DataChunk *chunk)

{
  DataChunk::Verify(input);
  Sink(this,input);
  if (this->fetch_next_left == false) {
    this->fetch_next_left = true;
    OuterJoinMarker::ConstructLeftJoinResult(&this->left_outer,input,chunk);
    if ((this->left_outer).enabled == true) {
      switchD_016d8eb1::default
                ((this->left_outer).found_match.
                 super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
                 super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                 super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                 super__Head_base<0UL,_bool_*,_false>._M_head_impl,0,(this->left_outer).count);
    }
  }
  return NEED_MORE_INPUT;
}

Assistant:

OperatorResultType AsOfLocalState::ExecuteInternal(ExecutionContext &context, DataChunk &input, DataChunk &chunk) {
	input.Verify();
	Sink(input);

	//	If there were any unmatchable rows, return them now so we can forget about them.
	if (!fetch_next_left) {
		fetch_next_left = true;
		left_outer.ConstructLeftJoinResult(input, chunk);
		left_outer.Reset();
	}

	//	Just keep asking for data and buffering it
	return OperatorResultType::NEED_MORE_INPUT;
}